

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::
GenMatcher<Kernel::TypedTermList>(GenMatcher *this,TypedTermList query,uint nextSpecVar)

{
  GenMatcher *in_RDX;
  undefined8 in_RSI;
  Stack<unsigned_int> *in_RDI;
  Stack<unsigned_int> *this_00;
  TypedTermList in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  Lib::Stack<unsigned_int>::Stack(in_RDI,(size_t)in_RDI);
  Lib::DArray<Kernel::TermList>::DArray((DArray<Kernel::TermList> *)this_00,(size_t)in_RDI);
  Lib::ArrayMap<Kernel::TermList>::ArrayMap((ArrayMap<Kernel::TermList> *)(in_RDI + 2));
  init<Kernel::TypedTermList>(in_RDX,in_stack_ffffffffffffffc8,(uint)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

GenMatcher(TermOrLit query, unsigned nextSpecVar)
      { init(query,nextSpecVar); }